

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_normalize_bosses_hp.hpp
# Opt level: O1

void __thiscall PatchNormalizeBossesHP::alter_rom(PatchNormalizeBossesHP *this,ROM *rom)

{
  md::ROM::set_byte(rom,0x118dc,'\x02');
  md::ROM::set_byte(rom,0x118ec,'\x02');
  md::ROM::set_word(rom,0x11d38,2);
  md::ROM::set_byte(rom,0x11d80,'\x02');
  md::ROM::set_byte(rom,0x11f8a,'\x02');
  md::ROM::set_byte(rom,0x11faa,'\x02');
  md::ROM::set_byte(rom,0x12072,'\x02');
  md::ROM::set_byte(rom,0x120c0,'\x02');
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        constexpr uint16_t NEW_THRESHOLD = 0x0002;

        // Make the HP check for unkillable enemies below NEW_THRESHOLD instead of below 0x6400
        rom.set_byte(0x118DC, NEW_THRESHOLD);
        rom.set_byte(0x118EC, NEW_THRESHOLD);
        rom.set_word(0x11D38, NEW_THRESHOLD);
        rom.set_byte(0x11D80, NEW_THRESHOLD);
        rom.set_byte(0x11F8A, NEW_THRESHOLD);
        rom.set_byte(0x11FAA, NEW_THRESHOLD);
        rom.set_byte(0x12072, NEW_THRESHOLD);
        rom.set_byte(0x120C0, NEW_THRESHOLD);
    }